

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall
el::Configurations::parseFromFile
          (Configurations *this,string *configurationFile,Configurations *base)

{
  ostream *poVar1;
  string *in_RSI;
  long in_RDI;
  bool success;
  stringstream internalInfoStream;
  bool assertionPassed;
  Configurations *in_stack_00000430;
  Configurations *in_stack_00000438;
  string *in_stack_00000440;
  string local_1e0 [48];
  stringstream local_1b0 [7];
  undefined1 in_stack_fffffffffffffe57;
  char *in_stack_fffffffffffffe58;
  ostream local_1a0 [383];
  byte local_21;
  string *local_18;
  bool local_1;
  
  local_21 = 1;
  local_18 = in_RSI;
  std::__cxx11::string::c_str();
  local_21 = el::base::utils::File::pathExists
                       (in_stack_fffffffffffffe58,(bool)in_stack_fffffffffffffe57);
  if (!(bool)local_21) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar1 = std::operator<<(local_1a0,"Configuration file [");
    poVar1 = std::operator<<(poVar1,local_18);
    std::operator<<(poVar1,"] does not exist!");
    poVar1 = std::operator<<((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xd5);
    poVar1 = std::operator<<(poVar1,
                             ") [(assertionPassed = base::utils::File::pathExists(configurationFile.c_str(), true)) == true"
                            );
    poVar1 = std::operator<<(poVar1,"] WITH MESSAGE \"");
    std::__cxx11::stringstream::str();
    poVar1 = std::operator<<(poVar1,local_1e0);
    poVar1 = std::operator<<(poVar1,"\"");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  if ((local_21 & 1) == 0) {
    local_1 = false;
  }
  else {
    local_1 = Parser::parseFromFile(in_stack_00000440,in_stack_00000438,in_stack_00000430);
    *(bool *)(in_RDI + 0x48) = local_1;
  }
  return local_1;
}

Assistant:

bool Configurations::parseFromFile(const std::string& configurationFile, Configurations* base) {
  // We initial assertion with true because if we have assertion diabled, we want to pass this
  // check and if assertion is enabled we will have values re-assigned any way.
  bool assertionPassed = true;
  ELPP_ASSERT((assertionPassed = base::utils::File::pathExists(configurationFile.c_str(), true)) == true,
              "Configuration file [" << configurationFile << "] does not exist!");
  if (!assertionPassed) {
    return false;
  }
  bool success = Parser::parseFromFile(configurationFile, this, base);
  m_isFromFile = success;
  return success;
}